

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sglrReferenceContext.hpp
# Opt level: O0

void __thiscall sglr::ReferenceContextLimits::ReferenceContextLimits(ReferenceContextLimits *this)

{
  ApiType apiType;
  ReferenceContextLimits *this_local;
  
  apiType = glu::ApiType::es(3,0);
  glu::ContextType::ContextType(&this->contextType,apiType,0);
  this->maxTextureImageUnits = 0x10;
  this->maxTexture2DSize = 0x800;
  this->maxTextureCubeSize = 0x800;
  this->maxTexture2DArrayLayers = 0x100;
  this->maxTexture3DSize = 0x100;
  this->maxRenderbufferSize = 0x800;
  this->maxVertexAttribs = 0x10;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->extensionList);
  std::__cxx11::string::string((string *)&this->extensionStr);
  return;
}

Assistant:

ReferenceContextLimits (void)
		: contextType				(glu::ApiType::es(3,0))
		, maxTextureImageUnits		(16)
		, maxTexture2DSize			(2048)
		, maxTextureCubeSize		(2048)
		, maxTexture2DArrayLayers	(256)
		, maxTexture3DSize			(256)
		, maxRenderbufferSize		(2048)
		, maxVertexAttribs			(16)
	{
	}